

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

HighsInt __thiscall
HighsOrbitopeMatrix::getBranchingColumn
          (HighsOrbitopeMatrix *this,vector<double,_std::allocator<double>_> *colLower,
          vector<double,_std::allocator<double>_> *colUpper,HighsInt col)

{
  int iVar1;
  ValueType *pVVar2;
  const_reference pvVar3;
  HighsInt *pHVar4;
  const_reference pvVar5;
  int in_ECX;
  vector<double,_std::allocator<double>_> *in_RDX;
  HighsHashTable<int,_int> *in_RSI;
  HighsOrbitopeMatrix *in_RDI;
  HighsInt branchCol;
  HighsInt j;
  HighsInt *i;
  value_type in_stack_ffffffffffffffb8;
  int local_34;
  
  pVVar2 = HighsHashTable<int,_int>::find(in_RSI,(KeyType_conflict *)in_RDX);
  if ((pVVar2 != (ValueType *)0x0) &&
     (pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (&in_RDI->rowIsSetPacking,(long)*pVVar2), *pvVar3 != '\0')) {
    for (local_34 = 0; local_34 < in_RDI->rowLength; local_34 = local_34 + 1) {
      pHVar4 = entry(in_RDI,(HighsInt)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                     SUB84(in_stack_ffffffffffffffb8,0));
      iVar1 = *pHVar4;
      if (iVar1 == in_ECX) {
        return in_ECX;
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_RSI,(long)iVar1);
      in_stack_ffffffffffffffb8 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)iVar1);
      if (in_stack_ffffffffffffffb8 != *pvVar5) {
        return iVar1;
      }
      if (NAN(in_stack_ffffffffffffffb8) || NAN(*pvVar5)) {
        return iVar1;
      }
    }
  }
  return in_ECX;
}

Assistant:

HighsInt HighsOrbitopeMatrix::getBranchingColumn(
    const std::vector<double>& colLower, const std::vector<double>& colUpper,
    HighsInt col) const {
  const HighsInt* i = columnToRow.find(col);
  if (i && rowIsSetPacking[*i]) {
    for (HighsInt j = 0; j < rowLength; ++j) {
      HighsInt branchCol = entry(*i, j);
      if (branchCol == col) break;
      if (colLower[branchCol] != colUpper[branchCol]) return branchCol;
    }
  }

  return col;
}